

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hpp
# Opt level: O1

void __thiscall
tf::Executor::_tear_down_dependent_async(Executor *this,Worker *worker,Node *node,Node **cache)

{
  int *piVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  atomic<unsigned_long> *paVar4;
  size_t *psVar5;
  Node *pNVar6;
  Semaphores *__ptr;
  undefined1 *__ptr_00;
  pointer pcVar7;
  int iVar8;
  void *pvVar9;
  handle_t *phVar10;
  ulong uVar11;
  bool bVar12;
  
  phVar10 = (handle_t *)0x0;
  if (*(__index_type *)
       ((long)&(node->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
       + 0x38) == '\b') {
    phVar10 = &node->_handle;
  }
  do {
    piVar1 = (int *)((long)&(phVar10->
                            super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            ).
                            super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            .
                            super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                            ._M_u + 0x30);
    LOCK();
    bVar12 = *piVar1 == 0;
    if (bVar12) {
      *piVar1 = 2;
    }
    UNLOCK();
  } while (!bVar12);
  pvVar9 = (node->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  if ((node->_edges).super_SmallVectorImpl<tf::Node_*>.
      super_SmallVectorTemplateBase<tf::Node_*,_true>.
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX != pvVar9) {
    uVar11 = 0;
    do {
      pNVar6 = *(Node **)((long)pvVar9 + uVar11 * 8);
      LOCK();
      paVar4 = &pNVar6->_join_counter;
      (paVar4->super___atomic_base<unsigned_long>)._M_i =
           (paVar4->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((paVar4->super___atomic_base<unsigned_long>)._M_i == 0) {
        if (*cache != (Node *)0x0) {
          _schedule(this,worker,*cache);
        }
        *cache = pNVar6;
      }
      uVar11 = uVar11 + 1;
      pvVar9 = (node->_edges).super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    } while (uVar11 < (ulong)((long)(node->_edges).super_SmallVectorImpl<tf::Node_*>.
                                    super_SmallVectorTemplateBase<tf::Node_*,_true>.
                                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                                    super_SmallVectorBase.EndX - (long)pvVar9 >> 3));
  }
  LOCK();
  plVar2 = (long *)((long)&(phVar10->
                           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           ).
                           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           .
                           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           ._M_u + 0x28);
  *plVar2 = *plVar2 + -1;
  UNLOCK();
  if ((node != (Node *)0x0) && (*plVar2 == 0)) {
    if ((node->_exception_ptr)._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    __ptr = (node->_semaphores)._M_t.
            super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>.
            _M_t.
            super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
            .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl;
    if (__ptr != (Semaphores *)0x0) {
      std::default_delete<tf::Node::Semaphores>::operator()
                ((default_delete<tf::Node::Semaphores> *)&node->_semaphores,__ptr);
    }
    (node->_semaphores)._M_t.
    super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                         *)&node->_handle);
    __ptr_00 = (undefined1 *)
               (node->_edges).super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    if ((U *)__ptr_00 !=
        &(node->_edges).super_SmallVectorImpl<tf::Node_*>.
         super_SmallVectorTemplateBase<tf::Node_*,_true>.
         super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
      free(__ptr_00);
    }
    pcVar7 = (node->_name)._M_dataplus._M_p;
    paVar3 = &(node->_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar7 != paVar3) {
      operator_delete(pcVar7,paVar3->_M_allocated_capacity + 1);
    }
    operator_delete(node,0xd8);
  }
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->_topology_mutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  psVar5 = &this->_num_topologies;
  *psVar5 = *psVar5 - 1;
  if (*psVar5 == 0) {
    std::condition_variable::notify_all();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_topology_mutex);
  return;
}

Assistant:

inline void Executor::_tear_down_dependent_async(Worker& worker, Node* node, Node*& cache) {

  auto handle = std::get_if<Node::DependentAsync>(&(node->_handle));

  // this async task comes from Executor
  auto target = ASTATE::UNFINISHED;

  while(!handle->state.compare_exchange_weak(target, ASTATE::FINISHED,
                                             std::memory_order_acq_rel,
                                             std::memory_order_relaxed)) {
    target = ASTATE::UNFINISHED;
  }
  
  // spawn successors whenever their dependencies are resolved
  for(size_t i=0; i<node->_edges.size(); ++i) {
    if(auto s = node->_edges[i]; 
      s->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1
    ) {
      _update_cache(worker, cache, s);
    }
  }
  
  // now the executor no longer needs to retain ownership
  if(handle->use_count.fetch_sub(1, std::memory_order_acq_rel) == 1) {
    recycle(node);
  }

  _decrement_topology();
}